

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

void __thiscall font2svg::ttf_file::ttf_file(ttf_file *this,string *fname)

{
  FT_Library pFVar1;
  FT_Error FVar2;
  ostream *poVar3;
  undefined8 uVar4;
  string *fname_local;
  ttf_file *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)fname);
  FVar2 = FT_Init_FreeType(&this->library);
  this->error = FVar2;
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"Init error code: ");
  std::ostream::operator<<(poVar3,this->error);
  pFVar1 = this->library;
  uVar4 = std::__cxx11::string::c_str();
  FVar2 = FT_New_Face(pFVar1,uVar4,0,&this->face);
  this->error = FVar2;
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nFace load error code: ");
  std::ostream::operator<<(poVar3,this->error);
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nfont filename: ");
  std::operator<<(poVar3,(string *)this);
  if (this->error != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"problem loading file ");
    poVar3 = std::operator<<(poVar3,(string *)this);
    std::operator<<(poVar3,"\n");
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nFamily Name: ");
  std::operator<<(poVar3,this->face->family_name);
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nStyle Name: ");
  std::operator<<(poVar3,this->face->style_name);
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nNumber of faces: ");
  std::ostream::operator<<(poVar3,this->face->num_faces);
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nNumber of glyphs: ");
  std::ostream::operator<<(poVar3,this->face->num_glyphs);
  return;
}

Assistant:

ttf_file( std::string fname )
	{
		filename = fname;
		error = FT_Init_FreeType( &library );
		debug << "Init error code: " << error;

		// Load a typeface
		error = FT_New_Face( library, filename.c_str(), 0, &face );
		debug << "\nFace load error code: " << error;
		debug << "\nfont filename: " << filename;
		if (error) {
			std::cerr << "problem loading file " << filename << "\n";
			exit(1);
		}
		debug << "\nFamily Name: " << face->family_name;
		debug << "\nStyle Name: " << face->style_name;
		debug << "\nNumber of faces: " << face->num_faces;
		debug << "\nNumber of glyphs: " << face->num_glyphs;
	}